

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O3

void vocdusave_me(voccxdef *ctx,objnum old_me)

{
  objucxdef *undoctx;
  int iVar1;
  uchar *puVar2;
  uint16_t tmp;
  
  undoctx = ctx->voccxundo;
  if (undoctx != (objucxdef *)0x0) {
    iVar1 = objuok(undoctx);
    if (iVar1 != 0) {
      puVar2 = objures(undoctx,'\x05',3);
      *puVar2 = '\x06';
      *(objnum *)(puVar2 + 1) = old_me;
      undoctx->objucxhead = undoctx->objucxhead + 3;
    }
  }
  return;
}

Assistant:

void vocdusave_me(voccxdef *ctx, objnum old_me)
{
    uchar     *p;
    objucxdef *uc = ctx->voccxundo;

    /* if we don't need to save undo, there's nothing to do */
    if (uc == 0 || !objuok(uc))
        return;

    /* reserve space for our record */
    p = objures(uc, OBJUCLI, 3);
    *p = VOC_UNDO_SETME;
    oswp2(p+1, old_me);

    /* absorb the space */
    uc->objucxhead += 3;
}